

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void plan(void)

{
  int iVar1;
  cursor_res cVar2;
  long lVar3;
  instruction *instr;
  anon_enum_32 *paVar4;
  uint8_t val;
  undefined1 uStack_c7;
  undefined2 uStack_c6;
  undefined4 uStack_c4;
  cursor_rdr local_c0;
  char err_msg [64];
  cursor_wtr wtr;
  plan plan;
  
  iVar1 = greatest_pre_test("roundtrip_plan_shoud_match");
  if (iVar1 == 0) {
    if ((greatest_info.flags & 2) == 0) {
      return;
    }
    fprintf(_stdout,"  %s\n","roundtrip_plan_shoud_match");
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    random_plan(&plan,is,100000);
    cursor_wtr_new(&wtr,test_buf,plan.req_buf_size);
    lVar3 = plan.nis + 1;
    instr = plan.is;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        if (wtr.state.pos == wtr.state.len) {
          cursor_rdr_new(&local_c0,test_buf,plan.req_buf_size);
          lVar3 = plan.nis + 1;
          paVar4 = &(plan.is)->endianness;
          goto LAB_0010517c;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",wtr.state.pos);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",wtr.state.len);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x302;
        greatest_info.msg = "Position and len do not match";
        goto LAB_001061a4;
      }
      cVar2 = cursor_pack_instr(&wtr,instr);
      greatest_info.assertions = greatest_info.assertions + 1;
      instr = instr + 1;
    } while (cVar2 == cursor_res_ok);
    fwrite("\nExpected: ",0xb,1,_stdout);
    fprintf(_stdout,"%d",0);
    fwrite("\n     Got: ",0xb,1,_stdout);
    fprintf(_stdout,"%d",(ulong)cVar2);
    fputc(10,_stdout);
    greatest_info.fail_line = 0x2fd;
    greatest_info.msg = "cursor_pack_le returned an error";
LAB_001061a4:
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    iVar1 = -1;
  }
  goto LAB_001061bd;
LAB_0010517c:
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
      break;
    }
    if (*paVar4 == big) {
      snprintf(err_msg,0x40,"Unpack value does not match at position %zd",local_c0.state.pos);
      switch(((instruction *)(paVar4 + -4))->it) {
      case it_u8:
        cVar2 = cursor_unpack_be_u8(&local_c0,&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8 == val) break;
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%u",(ulong)val);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x144;
LAB_001060ef:
        greatest_info.msg = err_msg;
        goto LAB_001060f6;
      case it_i8:
        cVar2 = cursor_unpack_be_i8(&local_c0,(int8_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8 != val) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",
                  (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->i8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)(uint)(int)(char)val);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x149;
          goto LAB_001060ef;
        }
        break;
      case it_u16:
        cVar2 = cursor_unpack_be_u16(&local_c0,(uint16_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16 != CONCAT11(uStack_c7,val)) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)CONCAT11(uStack_c7,val));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x14f;
          goto LAB_001060ef;
        }
        break;
      case it_i16:
        cVar2 = cursor_unpack_be_i16(&local_c0,(int16_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16 != CONCAT11(uStack_c7,val)) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",
                  (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->i16);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(uStack_c7,val));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x154;
          goto LAB_001060ef;
        }
        break;
      case it_u32:
        cVar2 = cursor_unpack_be_u32(&local_c0,(uint32_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32 !=
            CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x159;
          goto LAB_001060ef;
        }
        break;
      case it_i32:
        cVar2 = cursor_unpack_be_i32(&local_c0,(int32_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32 !=
            CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x15e;
LAB_00105e3f:
          greatest_info.msg = "instr->val.i32 != val";
          goto LAB_001060f6;
        }
        break;
      case it_u64:
        cVar2 = cursor_unpack_be_u64(&local_c0,(uint64_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64 !=
            CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%lu",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%lu",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x163;
          goto LAB_001060ef;
        }
        break;
      case it_i64:
        cVar2 = cursor_unpack_be_i64(&local_c0,(int64_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64 !=
            CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%ld",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%ld",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x168;
          goto LAB_001060ef;
        }
        break;
      case it_f:
        cVar2 = cursor_unpack_be_f(&local_c0,(float *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if ((((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f !=
             (float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) ||
           (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f) ||
            NAN((float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",(double)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",(double)(float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x16d;
          goto LAB_001060ef;
        }
        break;
      case it_d:
        cVar2 = cursor_unpack_be_d(&local_c0,(double *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if ((((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->d !=
             (double)CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) ||
           (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->d) ||
            NAN((double)CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x172;
          goto LAB_001060ef;
        }
        break;
      default:
switchD_001051d0_default:
        greatest_info.assertions = greatest_info.assertions + 1;
        goto LAB_00105fcb;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      if (cVar2 == cursor_res_ok) {
LAB_00105fcb:
        greatest_info.msg = (char *)0x0;
        cursor_unpack_and_compare_to_instr_res = 0;
      }
      else {
        greatest_info.fail_line = 0x175;
LAB_00105fb8:
        greatest_info.msg = "cursor_res_ok != res";
LAB_001060f6:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
        ;
        cursor_unpack_and_compare_to_instr_res = -1;
      }
    }
    else if (*paVar4 == little) {
      snprintf(err_msg,0x40,"Unpack value does not match at position %zd",local_c0.state.pos);
      switch(((instruction *)(paVar4 + -4))->it) {
      case it_u8:
        cVar2 = cursor_unpack_le_u8(&local_c0,&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8 != val) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)val);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x102;
          goto LAB_001060ef;
        }
        break;
      case it_i8:
        cVar2 = cursor_unpack_le_i8(&local_c0,(int8_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u8 != val) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",
                  (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->i8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)(uint)(int)(char)val);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x107;
          goto LAB_001060ef;
        }
        break;
      case it_u16:
        cVar2 = cursor_unpack_le_u16(&local_c0,(uint16_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16 != CONCAT11(uStack_c7,val)) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)CONCAT11(uStack_c7,val));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x10d;
          goto LAB_001060ef;
        }
        break;
      case it_i16:
        cVar2 = cursor_unpack_le_i16(&local_c0,(int16_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u16 != CONCAT11(uStack_c7,val)) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",
                  (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->i16);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(uStack_c7,val));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x112;
          goto LAB_001060ef;
        }
        break;
      case it_u32:
        cVar2 = cursor_unpack_le_u32(&local_c0,(uint32_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32 !=
            CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%u",(ulong)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x117;
          goto LAB_001060ef;
        }
        break;
      case it_i32:
        cVar2 = cursor_unpack_le_i32(&local_c0,(int32_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32 !=
            CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u32);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x11c;
          goto LAB_00105e3f;
        }
        break;
      case it_u64:
        cVar2 = cursor_unpack_le_u64(&local_c0,(uint64_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64 !=
            CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%lu",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%lu",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x121;
          goto LAB_001060ef;
        }
        break;
      case it_i64:
        cVar2 = cursor_unpack_le_i64(&local_c0,(int64_t *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64 !=
            CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%ld",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%ld",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x126;
          goto LAB_001060ef;
        }
        break;
      case it_f:
        cVar2 = cursor_unpack_le_f(&local_c0,(float *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if ((((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f !=
             (float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))) ||
           (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f) ||
            NAN((float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",(double)((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->f);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",(double)(float)CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)));
          fputc(10,_stdout);
          greatest_info.fail_line = 299;
          goto LAB_001060ef;
        }
        break;
      case it_d:
        cVar2 = cursor_unpack_le_d(&local_c0,(double *)&val);
        greatest_info.assertions = greatest_info.assertions + 1;
        if ((((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->d !=
             (double)CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))) ||
           (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->d) ||
            NAN((double)CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val)))))) {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",((anon_union_8_10_082b88cb_for_val *)(paVar4 + -2))->u64);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",CONCAT44(uStack_c4,CONCAT22(uStack_c6,CONCAT11(uStack_c7,val))));
          fputc(10,_stdout);
          greatest_info.fail_line = 0x130;
          goto LAB_001060ef;
        }
        break;
      default:
        goto switchD_001051d0_default;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      if (cVar2 == cursor_res_ok) goto LAB_00105fcb;
      greatest_info.fail_line = 0x133;
      goto LAB_00105fb8;
    }
    paVar4 = paVar4 + 8;
    iVar1 = cursor_unpack_and_compare_to_instr_res;
  } while (cursor_unpack_and_compare_to_instr_res == 0);
LAB_001061bd:
  greatest_post_test("roundtrip_plan_shoud_match",iVar1);
  return;
}

Assistant:

SUITE(plan) {
    RUN_TEST(roundtrip_plan_shoud_match);
}